

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHCurlEquationFilter.cpp
# Opt level: O0

bool __thiscall
TPZHCurlEquationFilter<std::complex<double>_>::FilterEdgeEquations
          (TPZHCurlEquationFilter<std::complex<double>_> *this,TPZCompMesh *cmesh,
          TPZVec<long> *activeEquations,bool domainHybridization)

{
  TPZCompEl *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference ppTVar5;
  TPZGeoEl *pTVar6;
  mapped_type *pmVar7;
  bool *pbVar8;
  mapped_type *pmVar9;
  reference piVar10;
  long lVar11;
  int64_t iVar12;
  TPZConnect *this_00;
  long *plVar13;
  size_type sVar14;
  ostream *poVar15;
  byte in_CL;
  TPZVec<long> *in_RDX;
  TPZCompMesh *in_RSI;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar16;
  int ieq;
  int64_t vs;
  int blocksize;
  int pos;
  int64_t seqnum;
  TPZConnect *con;
  int iCon;
  int edge;
  iterator __end0;
  iterator __begin0;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  bool local_check;
  set<int,_std::less<int>,_std::allocator<int>_> all_edges;
  int iv_1;
  bool check_edges_left;
  bool v;
  int iv;
  bool check_all_vertices;
  size_t i;
  int64_t remEdge;
  int64_t treatVertex;
  int64_t treated_nodes;
  int dimg;
  TPZGeoEl *gel;
  TPZCompEl *cel;
  iterator __end2;
  iterator __begin2;
  TPZAdmChunkVector<TPZCompEl_*,_10> *__range2;
  TPZVec<bool> done_vertices;
  int64_t nnodes;
  TPZGeoMesh *gmesh;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  TPZBlock *in_stack_fffffffffffffab0;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffab8;
  TPZCompMesh *in_stack_fffffffffffffac0;
  value_type_conflict5 *in_stack_fffffffffffffac8;
  TPZChunkVector<TPZConnect,_10> *in_stack_fffffffffffffad0;
  key_type_conflict1 *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  byte local_4a9;
  byte local_491;
  int64_t *in_stack_fffffffffffffbc0;
  mapped_type *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  int local_2b4;
  _Self local_290;
  long local_288;
  _Self local_280;
  int local_274;
  _Self local_270;
  long local_268;
  _Self local_260;
  int local_254;
  _Self local_250;
  _Self local_248;
  undefined1 *local_240;
  byte local_231;
  long local_230;
  undefined1 local_228 [48];
  int local_1f8;
  byte local_1f1;
  long local_1f0;
  byte local_1e1;
  int local_1e0;
  byte local_1d9;
  _Base_ptr local_1d8;
  undefined1 local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  int64_t *local_1b0;
  int64_t local_1a8;
  long local_1a0;
  _Base_ptr local_198;
  undefined1 local_190;
  TPZGeoMesh *in_stack_fffffffffffffe78;
  TPZHCurlEquationFilter<std::complex<double>_> *in_stack_fffffffffffffe80;
  _Rb_tree_const_iterator<long> in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed1;
  TPZChunkVectorIterator<false,_TPZCompEl_*,_10> local_90;
  TPZChunkVectorIterator<false,_TPZCompEl_*,_10> local_80;
  TPZAdmChunkVector<TPZCompEl_*,_10> *local_70;
  bool local_52 [2];
  TPZVec<bool> local_50;
  ulong local_30;
  TPZGeoMesh *local_28;
  byte local_19;
  TPZVec<long> *local_18;
  TPZCompMesh *local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZCompMesh::LoadReferences(in_stack_fffffffffffffac0);
  local_28 = TPZCompMesh::Reference(local_10);
  local_30 = TPZGeoMesh::NNodes((TPZGeoMesh *)0x1c232e9);
  local_52[1] = false;
  TPZVec<bool>::TPZVec
            ((TPZVec<bool> *)in_stack_fffffffffffffac0,(int64_t)in_stack_fffffffffffffab8,
             (bool *)in_stack_fffffffffffffab0);
  if ((local_19 & 1) == 0) {
    InitDataStructures(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    FirstEdge((TPZHCurlEquationFilter<std::complex<double>_> *)
              CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    for (local_1a0 = 2; local_1a0 < (long)local_30; local_1a0 = local_1a0 + 1) {
      ChooseVertexAndEdge((TPZHCurlEquationFilter<std::complex<double>_> *)
                          CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                          (int64_t *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      in_stack_fffffffffffffbc0 = local_1b0;
      in_stack_fffffffffffffbc8 =
           std::
           map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
           ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                         *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                        in_stack_fffffffffffffae8);
      in_stack_fffffffffffffbc8->removed_edge = (int64_t)in_stack_fffffffffffffbc0;
      pmVar9 = std::
               map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
               ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                             *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                            in_stack_fffffffffffffae8);
      iVar12 = local_1a8;
      pmVar9->status = ETreatedVertex;
      pmVar7 = std::
               map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
               ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                             *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                            in_stack_fffffffffffffae8);
      pmVar7->vertex_treated = iVar12;
      CheckFaces((TPZHCurlEquationFilter<std::complex<double>_> *)
                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    }
    for (local_1b8 = 0; local_1b8 < local_30; local_1b8 = local_1b8 + 1) {
      local_1c0 = local_1b8;
      pmVar9 = std::
               map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
               ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                             *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                            in_stack_fffffffffffffae8);
      if (pmVar9->status == ETreatedVertex) {
        pbVar8 = TPZVec<bool>::operator[](&local_50,local_1b8);
        *pbVar8 = true;
        local_1c8 = local_1b8;
        std::
        map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
        ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                      *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                     in_stack_fffffffffffffae8);
        pVar16 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                           ((set<long,_std::less<long>,_std::allocator<long>_> *)
                            in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
        local_1d8 = (_Base_ptr)pVar16.first._M_node;
        local_1d0 = pVar16.second;
      }
    }
  }
  else {
    local_52[0] = true;
    TPZVec<bool>::operator=(&local_50,local_52);
    local_70 = TPZCompMesh::ElementVec(local_10);
    TPZChunkVector<TPZCompEl_*,_10>::begin
              ((TPZChunkVector<TPZCompEl_*,_10> *)
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    TPZChunkVector<TPZCompEl_*,_10>::end(in_stack_fffffffffffffab8);
    while (bVar2 = TPZChunkVectorIterator<false,_TPZCompEl_*,_10>::operator!=
                             ((TPZChunkVectorIterator<false,_TPZCompEl_*,_10> *)
                              in_stack_fffffffffffffab0,
                              (TPZChunkVectorIterator<false,_TPZCompEl_*,_10> *)
                              CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8)), bVar2)
    {
      ppTVar5 = TPZChunkVectorIterator<false,_TPZCompEl_*,_10>::operator*
                          ((TPZChunkVectorIterator<false,_TPZCompEl_*,_10> *)0x1c23449);
      pTVar1 = *ppTVar5;
      if (pTVar1 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)pTVar1 + 0x68))();
        pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffab8);
        if (pTVar6 != (TPZGeoEl *)0x0) {
          (**(code **)(*(long *)pTVar6 + 0x210))();
          iVar3 = (**(code **)(*(long *)pTVar6 + 0x210))();
          if (iVar3 == 3) {
            iVar3 = (**(code **)(*(long *)pTVar6 + 0xb8))();
            if (iVar3 == 4) {
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,0);
              std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,1);
              std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,5);
              std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
            }
            else if (iVar3 == 7) {
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,0);
              std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,1);
              std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,3);
              pVar16 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                                 ((set<long,_std::less<long>,_std::allocator<long>_> *)
                                  in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              in_stack_fffffffffffffec8 = pVar16.first._M_node;
              in_stack_fffffffffffffed0 = pVar16.second;
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,6);
              std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,7);
              std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,8);
              std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              (**(code **)(*(long *)pTVar1 + 0xa0))(pTVar1,0xb);
              pVar16 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                                 ((set<long,_std::less<long>,_std::allocator<long>_> *)
                                  in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              local_198 = (_Base_ptr)pVar16.first._M_node;
              local_190 = pVar16.second;
            }
            else {
              pzinternal::DebugStopImpl
                        ((char *)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0),
                         (size_t)in_stack_fffffffffffffec8._M_node);
            }
          }
        }
      }
      TPZChunkVectorIterator<false,_TPZCompEl_*,_10>::operator++(&local_80);
    }
    TPZChunkVectorIterator<false,_TPZCompEl_*,_10>::~TPZChunkVectorIterator(&local_90);
    TPZChunkVectorIterator<false,_TPZCompEl_*,_10>::~TPZChunkVectorIterator(&local_80);
  }
  if ((local_19 & 1) == 0) {
    local_1d9 = 1;
    for (local_1e0 = 0; (long)local_1e0 < (long)local_30; local_1e0 = local_1e0 + 1) {
      local_1e1 = 1;
      local_1f0 = (long)local_1e0;
      pmVar9 = std::
               map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
               ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                             *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                            in_stack_fffffffffffffae8);
      if (pmVar9->status != ETreatedVertex) {
        local_1e1 = 0;
      }
      local_491 = 0;
      if ((local_1d9 & 1) != 0) {
        local_491 = local_1e1;
      }
      local_1d9 = local_491 & 1;
      if ((local_1e1 & 1) == 0) break;
    }
    if (local_1d9 == 0) {
      pzinternal::DebugStopImpl
                ((char *)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0),
                 (size_t)in_stack_fffffffffffffec8._M_node);
    }
    local_1f1 = 1;
    for (local_1f8 = 0; (long)local_1f8 < (long)local_30; local_1f8 = local_1f8 + 1) {
      local_230 = (long)local_1f8;
      std::
      map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
      ::operator[]((map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                    *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                   in_stack_fffffffffffffae8);
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_231 = 0;
      local_240 = local_228;
      local_248._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      local_250._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      while (bVar2 = std::operator!=(&local_248,&local_250), bVar2) {
        piVar10 = std::_Rb_tree_const_iterator<int>::operator*
                            ((_Rb_tree_const_iterator<int> *)0x1c23f83);
        local_254 = *piVar10;
        local_268 = (long)local_254;
        local_260._M_node =
             (_Base_ptr)
             std::set<long,_std::less<long>,_std::allocator<long>_>::find
                       ((set<long,_std::less<long>,_std::allocator<long>_> *)
                        in_stack_fffffffffffffab8,(key_type_conflict1 *)in_stack_fffffffffffffab0);
        local_270._M_node =
             (_Base_ptr)
             std::set<long,_std::less<long>,_std::allocator<long>_>::end
                       ((set<long,_std::less<long>,_std::allocator<long>_> *)
                        CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        bVar2 = std::operator==(&local_260,&local_270);
        if (bVar2) {
          local_231 = 1;
          break;
        }
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffab0);
      }
      local_4a9 = 0;
      if ((local_231 & 1) != 0) {
        local_4a9 = local_1f1;
      }
      local_1f1 = local_4a9 & 1;
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1c2408b);
    }
  }
  (*local_18->_vptr_TPZVec[3])(local_18,0);
  for (local_274 = 0; lVar11 = (long)local_274,
      iVar12 = TPZCompMesh::NConnects((TPZCompMesh *)0x1c240e2), lVar11 < iVar12;
      local_274 = local_274 + 1) {
    local_288 = (long)local_274;
    local_280._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::find
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffab8,
                    (key_type_conflict1 *)in_stack_fffffffffffffab0);
    local_290._M_node =
         (_Base_ptr)
         std::set<long,_std::less<long>,_std::allocator<long>_>::end
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)
                    CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    bVar2 = std::operator==(&local_280,&local_290);
    if (bVar2) {
      TPZCompMesh::ConnectVec(local_10);
      this_00 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (in_stack_fffffffffffffad0,(int64_t)in_stack_fffffffffffffac8);
      iVar3 = TPZConnect::HasDependency(this_00);
      if (((iVar3 == 0) && (iVar12 = TPZConnect::SequenceNumber(this_00), -1 < iVar12)) &&
         (bVar2 = TPZConnect::IsCondensed(this_00), !bVar2)) {
        TPZCompMesh::Block(local_10);
        iVar3 = TPZBlock::Position(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
        TPZCompMesh::Block(local_10);
        iVar4 = TPZBlock::Size(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
        if (iVar4 != 0) {
          iVar12 = TPZVec<long>::size(local_18);
          (*local_18->_vptr_TPZVec[3])(local_18,iVar12 + iVar4);
          for (local_2b4 = 0; local_2b4 < iVar4; local_2b4 = local_2b4 + 1) {
            plVar13 = TPZVec<long>::operator[](local_18,iVar12 + local_2b4);
            *plVar13 = (long)(iVar3 + local_2b4);
          }
        }
      }
    }
  }
  if (((local_19 & 1) == 0) &&
     (sVar14 = std::set<long,_std::less<long>,_std::allocator<long>_>::size
                         ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1c243b2),
     sVar14 != local_30 - 1)) {
    poVar15 = std::operator<<((ostream *)&std::cout,"Removed ");
    sVar14 = std::set<long,_std::less<long>,_std::allocator<long>_>::size
                       ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1c243f5);
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,sVar14);
    poVar15 = std::operator<<(poVar15,"/");
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_30 - 1);
    in_stack_fffffffffffffab0 = (TPZBlock *)std::operator<<(poVar15," allowed connects.");
    std::ostream::operator<<(in_stack_fffffffffffffab0,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl
              ((char *)CONCAT71(in_stack_fffffffffffffed1,in_stack_fffffffffffffed0),
               (size_t)in_stack_fffffffffffffec8._M_node);
  }
  TPZVec<bool>::~TPZVec((TPZVec<bool> *)in_stack_fffffffffffffab0);
  return false;
}

Assistant:

bool TPZHCurlEquationFilter<TVar>::FilterEdgeEquations(TPZCompMesh* cmesh,
                    TPZVec<int64_t> &activeEquations, bool domainHybridization)
{

    cmesh->LoadReferences();
    const auto gmesh = cmesh->Reference();  
    auto nnodes = gmesh->NNodes();

    TPZVec<bool> done_vertices(nnodes, false);

    if (domainHybridization)
    {
        done_vertices = true;
        for (auto cel : cmesh->ElementVec())
        {   
            if (!cel) continue;
            cel->LoadElementReference();
            auto gel = cel->Reference();
            if (!gel) continue;
            int dimg = gel->Dimension();
            if (gel->Dimension() != 3) continue;

            switch (gel->Type())
            {
            case ETetraedro:
                removed_edges.insert(cel->ConnectIndex(0));
                removed_edges.insert(cel->ConnectIndex(1));
                removed_edges.insert(cel->ConnectIndex(5));
                break;
            case ECube:
                removed_edges.insert(cel->ConnectIndex(0));
                removed_edges.insert(cel->ConnectIndex(1));
                removed_edges.insert(cel->ConnectIndex(3));
                removed_edges.insert(cel->ConnectIndex(6));
                removed_edges.insert(cel->ConnectIndex(7));
                removed_edges.insert(cel->ConnectIndex(8));
                removed_edges.insert(cel->ConnectIndex(11));
                break;
            
            default:
                DebugStop();
                break;
            }
        }      
   
    } else {
        //Initialize the data structures
        InitDataStructures(gmesh);

        // Choose the first edge to be removed
        FirstEdge();

        // Always starts with 1 nodes treated + 1 node which edge will not be removed
        int64_t treated_nodes = 2;

        // While there is a node to be treated
        while (treated_nodes < nnodes)
        {
            // - Escolher um nó do mapa
            int64_t treatVertex, remEdge;
            ChooseVertexAndEdge(treatVertex,remEdge);

            mVertex[treatVertex].removed_edge = remEdge;
            mVertex[treatVertex].status = ETreatedVertex;
            mEdge[remEdge].vertex_treated = treatVertex;

            // Updates the edges (if some needs to be blocked) and faces status.
            // UpdateEdgeAndFaceStatus(remEdge);
            
            // Checks if all edges of a face have been removed
            CheckFaces();

            treated_nodes++;
            
        }//while

        for (size_t i = 0; i < nnodes; i++)//skip the first node since it is not associated to a removed edge
        {
            if (mVertex[i].status == ETreatedVertex) {
                done_vertices[i] = true;
                removed_edges.insert(mVertex[i].removed_edge);
            }
        }
    }
    
    // std::cout << "Removed (" << removed_edges.size() << ") = ";
    // for (auto rem : removed_edges)
    // {
    //     std::cout << rem << " " ;
    // }
    // std::cout << std::endl;

    // for (int i = 0; i < nnodes; i++)
    // {
    //     std::cout << "MVertex (" << i << ") = " << mVertex[i].removed_edge << std::endl;
    // }
    
    



    if (!domainHybridization){
        bool check_all_vertices{true};
        for(auto iv = 0; iv < nnodes; iv++){
            bool v = true;
            if (mVertex[iv].status != ETreatedVertex) v = false;
            check_all_vertices = check_all_vertices && v;
            if(!v){
            break;
            }
        }
        if (!check_all_vertices) DebugStop();
     
        bool check_edges_left{true};
        for(auto iv = 0; iv < nnodes; iv++){
            const auto all_edges = mVertex[iv].edge_connect;
            bool local_check{false};
            for(auto edge: all_edges){
                if(removed_edges.find(edge) == removed_edges.end()){
                    local_check = true;
                    break;
                }
            }
            check_edges_left = local_check && check_edges_left;
        }

        // if (!check_edges_left) DebugStop();
    }


    activeEquations.Resize(0);
    for (int iCon = 0; iCon < cmesh->NConnects(); iCon++) {
        if (removed_edges.find(iCon) == removed_edges.end()) {
            auto &con = cmesh->ConnectVec()[iCon];
            if (con.HasDependency()){
                continue;
            }
            const auto seqnum = con.SequenceNumber();
            if (seqnum<0) continue;
            if (con.IsCondensed()) continue;


            const auto pos = cmesh->Block().Position(seqnum);
            const auto blocksize = cmesh->Block().Size(seqnum);
            if (blocksize == 0){
                continue;
            }
            
            const auto vs = activeEquations.size();
            activeEquations.Resize(vs + blocksize);
            for (auto ieq = 0; ieq < blocksize; ieq++) {
                activeEquations[vs + ieq] = pos + ieq;
            }
        }
    }
    
    if (!domainHybridization){
        if (removed_edges.size() != nnodes-1){
            std::cout << "Removed " << removed_edges.size() << "/" << nnodes-1 << " allowed connects."  << std::endl;
            DebugStop();
        }
    } 

    return 0;
}